

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_rcbuf.c
# Opt level: O0

int nghttp2_rcbuf_new2(nghttp2_rcbuf **rcbuf_ptr,uint8_t *src,size_t srclen,nghttp2_mem *mem)

{
  uint8_t *puVar1;
  int rv;
  nghttp2_mem *mem_local;
  size_t srclen_local;
  uint8_t *src_local;
  nghttp2_rcbuf **rcbuf_ptr_local;
  
  rcbuf_ptr_local._4_4_ = nghttp2_rcbuf_new(rcbuf_ptr,srclen + 1,mem);
  if (rcbuf_ptr_local._4_4_ == 0) {
    (*rcbuf_ptr)->len = srclen;
    puVar1 = nghttp2_cpymem((*rcbuf_ptr)->base,src,srclen);
    *puVar1 = '\0';
    rcbuf_ptr_local._4_4_ = 0;
  }
  return rcbuf_ptr_local._4_4_;
}

Assistant:

int nghttp2_rcbuf_new2(nghttp2_rcbuf **rcbuf_ptr, const uint8_t *src,
                       size_t srclen, nghttp2_mem *mem) {
  int rv;

  rv = nghttp2_rcbuf_new(rcbuf_ptr, srclen + 1, mem);
  if (rv != 0) {
    return rv;
  }

  (*rcbuf_ptr)->len = srclen;
  *nghttp2_cpymem((*rcbuf_ptr)->base, src, srclen) = '\0';

  return 0;
}